

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress_insertDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,
                 void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,void *workspace)

{
  U32 UVar1;
  long in_RCX;
  size_t in_RDX;
  void *in_RSI;
  ZSTD_compressedBlockState_t *in_RDI;
  ulong in_R8;
  int in_R9D;
  ZSTD_dictTableLoadMethod_e in_stack_00000184;
  size_t in_stack_00000188;
  void *in_stack_00000190;
  ZSTD_CCtx_params *in_stack_00000198;
  ZSTD_matchState_t *in_stack_000001a0;
  ZSTD_compressedBlockState_t *in_stack_000001a8;
  void *in_stack_000001c0;
  void *in_stack_ffffffffffffffb8;
  ZSTD_dictTableLoadMethod_e dtlm_00;
  ZSTD_matchState_t *in_stack_fffffffffffffff8;
  size_t sVar2;
  
  if ((in_RCX == 0) || (in_R8 < 9)) {
    sVar2 = 0;
  }
  else {
    ZSTD_reset_compressedBlockState(in_RDI);
    dtlm_00 = (ZSTD_dictTableLoadMethod_e)((ulong)in_RCX >> 0x20);
    if (in_R9D == 1) {
      sVar2 = ZSTD_loadDictionaryContent
                        (in_stack_fffffffffffffff8,(ZSTD_CCtx_params *)in_RDI,in_RSI,in_RDX,dtlm_00)
      ;
    }
    else {
      UVar1 = MEM_readLE32(in_stack_ffffffffffffffb8);
      if (UVar1 != 0xec30a437) {
        if (in_R9D == 0) {
          sVar2 = ZSTD_loadDictionaryContent
                            (in_stack_fffffffffffffff8,(ZSTD_CCtx_params *)in_RDI,in_RSI,in_RDX,
                             dtlm_00);
          return sVar2;
        }
        if (in_R9D == 2) {
          return 0xffffffffffffffe0;
        }
      }
      sVar2 = ZSTD_loadZstdDictionary
                        (in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                         in_stack_00000188,in_stack_00000184,in_stack_000001c0);
    }
  }
  return sVar2;
}

Assistant:

static size_t
ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t* bs,
                               ZSTD_matchState_t* ms,
                         const ZSTD_CCtx_params* params,
                         const void* dict, size_t dictSize,
                               ZSTD_dictContentType_e dictContentType,
                               ZSTD_dictTableLoadMethod_e dtlm,
                               void* workspace)
{
    DEBUGLOG(4, "ZSTD_compress_insertDictionary (dictSize=%u)", (U32)dictSize);
    if ((dict==NULL) || (dictSize<=8)) return 0;

    ZSTD_reset_compressedBlockState(bs);

    /* dict restricted modes */
    if (dictContentType == ZSTD_dct_rawContent)
        return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);

    if (MEM_readLE32(dict) != ZSTD_MAGIC_DICTIONARY) {
        if (dictContentType == ZSTD_dct_auto) {
            DEBUGLOG(4, "raw content dictionary detected");
            return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);
        }
        if (dictContentType == ZSTD_dct_fullDict)
            return ERROR(dictionary_wrong);
        assert(0);   /* impossible */
    }

    /* dict as full zstd dictionary */
    return ZSTD_loadZstdDictionary(bs, ms, params, dict, dictSize, dtlm, workspace);
}